

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

void al_unlock_index_buffer(ALLEGRO_INDEX_BUFFER *buffer)

{
  uint uVar1;
  undefined8 uVar2;
  ALLEGRO_INDEX_BUFFER *in_RDI;
  int flags;
  
  uVar2 = al_get_current_display();
  uVar1 = al_get_display_flags(uVar2);
  if (((in_RDI->common).is_locked & 1U) != 0) {
    (in_RDI->common).is_locked = false;
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 8) != 0) {
        _al_unlock_index_buffer_directx(in_RDI);
      }
    }
    else {
      _al_unlock_index_buffer_opengl((ALLEGRO_INDEX_BUFFER *)0x1150c6);
    }
  }
  return;
}

Assistant:

void al_unlock_index_buffer(ALLEGRO_INDEX_BUFFER* buffer)
{
	int flags = al_get_display_flags(al_get_current_display());
   ASSERT(buffer);
   ASSERT(addon_initialized);

   if (!buffer->common.is_locked)
      return;

   buffer->common.is_locked = false;

   if (flags & ALLEGRO_OPENGL) {
      _al_unlock_index_buffer_opengl(buffer);
   }
   else if (flags & ALLEGRO_DIRECT3D) {
      _al_unlock_index_buffer_directx(buffer);
   }
}